

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void blowfish_decrypt(uint32_t xL,uint32_t xR,uint32_t *output,BlowfishContext *ctx)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t t;
  uint32_t *P;
  uint32_t *S3;
  uint32_t *S2;
  uint32_t *S1;
  uint32_t *S0;
  BlowfishContext *ctx_local;
  uint32_t *output_local;
  uint32_t xR_local;
  uint32_t xL_local;
  
  uVar4 = ctx->P[0x11] ^ xL;
  uVar5 = ctx->P[0x10] ^
          (ctx->S0[uVar4 >> 0x18] + ctx->S1[uVar4 >> 0x10 & 0xff] ^ ctx->S2[uVar4 >> 8 & 0xff]) +
          ctx->S3[uVar4 & 0xff] ^ xR;
  uVar4 = ctx->P[0xf] ^
          (ctx->S0[uVar5 >> 0x18] + ctx->S1[uVar5 >> 0x10 & 0xff] ^ ctx->S2[uVar5 >> 8 & 0xff]) +
          ctx->S3[uVar5 & 0xff] ^ uVar4;
  uVar5 = ctx->P[0xe] ^
          (ctx->S0[uVar4 >> 0x18] + ctx->S1[uVar4 >> 0x10 & 0xff] ^ ctx->S2[uVar4 >> 8 & 0xff]) +
          ctx->S3[uVar4 & 0xff] ^ uVar5;
  uVar4 = ctx->P[0xd] ^
          (ctx->S0[uVar5 >> 0x18] + ctx->S1[uVar5 >> 0x10 & 0xff] ^ ctx->S2[uVar5 >> 8 & 0xff]) +
          ctx->S3[uVar5 & 0xff] ^ uVar4;
  uVar5 = ctx->P[0xc] ^
          (ctx->S0[uVar4 >> 0x18] + ctx->S1[uVar4 >> 0x10 & 0xff] ^ ctx->S2[uVar4 >> 8 & 0xff]) +
          ctx->S3[uVar4 & 0xff] ^ uVar5;
  uVar4 = ctx->P[0xb] ^
          (ctx->S0[uVar5 >> 0x18] + ctx->S1[uVar5 >> 0x10 & 0xff] ^ ctx->S2[uVar5 >> 8 & 0xff]) +
          ctx->S3[uVar5 & 0xff] ^ uVar4;
  uVar5 = ctx->P[10] ^
          (ctx->S0[uVar4 >> 0x18] + ctx->S1[uVar4 >> 0x10 & 0xff] ^ ctx->S2[uVar4 >> 8 & 0xff]) +
          ctx->S3[uVar4 & 0xff] ^ uVar5;
  uVar4 = ctx->P[9] ^
          (ctx->S0[uVar5 >> 0x18] + ctx->S1[uVar5 >> 0x10 & 0xff] ^ ctx->S2[uVar5 >> 8 & 0xff]) +
          ctx->S3[uVar5 & 0xff] ^ uVar4;
  uVar5 = ctx->P[8] ^
          (ctx->S0[uVar4 >> 0x18] + ctx->S1[uVar4 >> 0x10 & 0xff] ^ ctx->S2[uVar4 >> 8 & 0xff]) +
          ctx->S3[uVar4 & 0xff] ^ uVar5;
  uVar4 = ctx->P[7] ^
          (ctx->S0[uVar5 >> 0x18] + ctx->S1[uVar5 >> 0x10 & 0xff] ^ ctx->S2[uVar5 >> 8 & 0xff]) +
          ctx->S3[uVar5 & 0xff] ^ uVar4;
  uVar5 = ctx->P[6] ^
          (ctx->S0[uVar4 >> 0x18] + ctx->S1[uVar4 >> 0x10 & 0xff] ^ ctx->S2[uVar4 >> 8 & 0xff]) +
          ctx->S3[uVar4 & 0xff] ^ uVar5;
  uVar4 = ctx->P[5] ^
          (ctx->S0[uVar5 >> 0x18] + ctx->S1[uVar5 >> 0x10 & 0xff] ^ ctx->S2[uVar5 >> 8 & 0xff]) +
          ctx->S3[uVar5 & 0xff] ^ uVar4;
  uVar5 = ctx->P[4] ^
          (ctx->S0[uVar4 >> 0x18] + ctx->S1[uVar4 >> 0x10 & 0xff] ^ ctx->S2[uVar4 >> 8 & 0xff]) +
          ctx->S3[uVar4 & 0xff] ^ uVar5;
  uVar6 = ctx->P[3] ^
          (ctx->S0[uVar5 >> 0x18] + ctx->S1[uVar5 >> 0x10 & 0xff] ^ ctx->S2[uVar5 >> 8 & 0xff]) +
          ctx->S3[uVar5 & 0xff] ^ uVar4;
  uVar7 = ctx->P[2] ^
          (ctx->S0[uVar6 >> 0x18] + ctx->S1[uVar6 >> 0x10 & 0xff] ^ ctx->S2[uVar6 >> 8 & 0xff]) +
          ctx->S3[uVar6 & 0xff] ^ uVar5;
  uVar1 = ctx->S0[uVar7 >> 0x18];
  uVar2 = ctx->S1[uVar7 >> 0x10 & 0xff];
  uVar4 = ctx->S2[uVar7 >> 8 & 0xff];
  uVar3 = ctx->S3[uVar7 & 0xff];
  uVar5 = ctx->P[1];
  *output = ctx->P[0] ^ uVar7;
  output[1] = uVar5 ^ (uVar1 + uVar2 ^ uVar4) + uVar3 ^ uVar6;
  return;
}

Assistant:

static void blowfish_decrypt(uint32_t xL, uint32_t xR, uint32_t *output,
                             BlowfishContext * ctx)
{
    uint32_t *S0 = ctx->S0;
    uint32_t *S1 = ctx->S1;
    uint32_t *S2 = ctx->S2;
    uint32_t *S3 = ctx->S3;
    uint32_t *P = ctx->P;
    uint32_t t;

    ROUND(17);
    ROUND(16);
    ROUND(15);
    ROUND(14);
    ROUND(13);
    ROUND(12);
    ROUND(11);
    ROUND(10);
    ROUND(9);
    ROUND(8);
    ROUND(7);
    ROUND(6);
    ROUND(5);
    ROUND(4);
    ROUND(3);
    ROUND(2);
    xL ^= P[1];
    xR ^= P[0];

    output[0] = xR;
    output[1] = xL;
}